

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* __thiscall
kainjow::mustache::split<std::__cxx11::wstring>
          (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *__return_storage_ptr__,mustache *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s,
          value_type delim)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  wistream *pwVar3;
  undefined1 local_1d8 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> item;
  wstringstream local_1a8 [8];
  basic_stringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss;
  value_type delim_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s_local;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *elems;
  
  Catch::clara::std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(__return_storage_ptr__);
  _Var2 = Catch::clara::std::operator|(_S_out,_S_in);
  std::__cxx11::wstringstream::wstringstream(local_1a8,(wstring *)this,_Var2);
  std::__cxx11::wstring::wstring((wstring *)local_1d8);
  while( true ) {
    pwVar3 = std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
                       ((wistream *)local_1a8,(wstring *)local_1d8,(wchar_t)s);
    bVar1 = std::wios::operator_cast_to_bool((wios *)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18)));
    if (!bVar1) break;
    Catch::clara::std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_1d8);
  }
  std::__cxx11::wstring::~wstring((wstring *)local_1d8);
  std::__cxx11::wstringstream::~wstringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<string_type> split(const string_type& s, typename string_type::value_type delim) {
    std::vector<string_type> elems;
    std::basic_stringstream<typename string_type::value_type> ss(s);
    string_type item;
    while (std::getline(ss, item, delim)) {
        elems.push_back(item);
    }
    return elems;
}